

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void ForEachOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  TidyOption topt;
  TidyIterator pos;
  OptionDesc d;
  TidyIterator local_b8;
  OptionDesc local_b0;
  
  local_b8 = tidyGetOptionList(tdoc);
  if (local_b8 != (TidyIterator)0x0) {
    do {
      topt = tidyGetNextOption(tdoc,&local_b8);
      GetOption(tdoc,topt,&local_b0);
      (*OptionPrint)(tdoc,topt,&local_b0);
    } while (local_b8 != (TidyIterator)0x0);
  }
  return;
}

Assistant:

static void ForEachOption(TidyDoc tdoc,          /**< The Tidy document. */
                          OptionFunc OptionPrint /**< The printing function to be used. */
)
{
    TidyIterator pos = tidyGetOptionList( tdoc );

    while ( pos )
    {
        TidyOption topt = tidyGetNextOption( tdoc, &pos );
        OptionDesc d;

        GetOption( tdoc, topt, &d );
        (*OptionPrint)( tdoc, topt, &d );
    }
}